

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

int __thiscall
glslang::HlslParseContext::flattenArray
          (HlslParseContext *this,TVariable *variable,TType *type,TFlattenData *flattenData,
          TString *name,bool linkage,TQualifier *outerQualifier)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> __str;
  char elementNumBuf [20];
  TType dereferencedType;
  
  iVar2 = (*type->_vptr_TType[0x1e])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (*type->_vptr_TType[0xf])(type);
    TType::TType(&dereferencedType,type,0,false);
    if (name->_M_string_length == 0) {
      iVar3 = (*(variable->super_TSymbol)._vptr_TSymbol[3])(variable);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(name,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     CONCAT44(extraout_var,iVar3));
    }
    iVar3 = (int)((ulong)((long)(flattenData->offsets).
                                super_vector<int,_glslang::pool_allocator<int>_>.
                                super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(flattenData->offsets).
                               super_vector<int,_glslang::pool_allocator<int>_>.
                               super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    __str._M_dataplus.super_allocator_type.allocator._0_4_ = 0xffffffff;
    std::vector<int,_glslang::pool_allocator<int>_>::resize
              (&(flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>,
               (long)(iVar3 + iVar2),(value_type_conflict6 *)&__str);
    if (0 < iVar2) {
      uVar5 = 0;
      do {
        snprintf(elementNumBuf,0x13,"[%d]",uVar5 & 0xffffffff);
        __str._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        pcVar1 = (name->_M_dataplus)._M_p;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&__str,pcVar1,pcVar1 + name->_M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&__str,elementNumBuf);
        iVar4 = (*type->_vptr_TType[0x13])(type);
        iVar4 = addFlattenedMember(this,variable,&dereferencedType,flattenData,&__str,linkage,
                                   outerQualifier,(TArraySizes *)CONCAT44(extraout_var_00,iVar4));
        (flattenData->offsets).super_vector<int,_glslang::pool_allocator<int>_>.
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)iVar3 + uVar5] = iVar4;
        uVar5 = uVar5 + 1;
      } while (iVar2 != (int)uVar5);
    }
    return iVar3;
  }
  __assert_fail("type.isSizedArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                ,0x52d,
                "int glslang::HlslParseContext::flattenArray(const TVariable &, const TType &, TFlattenData &, TString, bool, const TQualifier &)"
               );
}

Assistant:

int HlslParseContext::flattenArray(const TVariable& variable, const TType& type,
                                   TFlattenData& flattenData, TString name, bool linkage,
                                   const TQualifier& outerQualifier)
{
    assert(type.isSizedArray());

    const int size = type.getOuterArraySize();
    const TType dereferencedType(type, 0);

    if (name.empty())
        name = variable.getName();

    // Reserve space for this tree level.
    int start = static_cast<int>(flattenData.offsets.size());
    int pos   = start;
    flattenData.offsets.resize(int(pos + size), -1);

    for (int element=0; element < size; ++element) {
        char elementNumBuf[20];  // sufficient for MAXINT
        snprintf(elementNumBuf, sizeof(elementNumBuf)-1, "[%d]", element);
        const int mpos = addFlattenedMember(variable, dereferencedType, flattenData,
                                            name + elementNumBuf, linkage, outerQualifier,
                                            type.getArraySizes());

        flattenData.offsets[pos++] = mpos;
    }

    return start;
}